

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDebugDumpAttrList(void)

{
  int iVar1;
  int iVar2;
  FILE *val;
  xmlAttrPtr val_00;
  int local_34;
  int n_depth;
  int depth;
  int n_attr;
  xmlAttrPtr attr;
  int n_output;
  FILE *output;
  int mem_base;
  int test_ret;
  
  output._4_4_ = 0;
  for (attr._4_4_ = 0; (int)attr._4_4_ < 2; attr._4_4_ = attr._4_4_ + 1) {
    for (n_depth = 0; n_depth < 2; n_depth = n_depth + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_debug_FILE_ptr(attr._4_4_,0);
        val_00 = gen_xmlAttrPtr(n_depth,1);
        iVar2 = gen_int(local_34,2);
        xmlDebugDumpAttrList(val,val_00,iVar2);
        call_tests = call_tests + 1;
        des_debug_FILE_ptr(attr._4_4_,val,0);
        des_xmlAttrPtr(n_depth,val_00,1);
        des_int(local_34,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttrList",(ulong)(uint)(iVar2 - iVar1));
          output._4_4_ = output._4_4_ + 1;
          printf(" %d",(ulong)attr._4_4_);
          printf(" %d",(ulong)(uint)n_depth);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return output._4_4_;
}

Assistant:

static int
test_xmlDebugDumpAttrList(void) {
    int test_ret = 0;

#if defined(LIBXML_DEBUG_ENABLED)
    int mem_base;
    FILE * output; /* the FILE * for the output */
    int n_output;
    xmlAttrPtr attr; /* the attribute list */
    int n_attr;
    int depth; /* the indentation level. */
    int n_depth;

    for (n_output = 0;n_output < gen_nb_debug_FILE_ptr;n_output++) {
    for (n_attr = 0;n_attr < gen_nb_xmlAttrPtr;n_attr++) {
    for (n_depth = 0;n_depth < gen_nb_int;n_depth++) {
        mem_base = xmlMemBlocks();
        output = gen_debug_FILE_ptr(n_output, 0);
        attr = gen_xmlAttrPtr(n_attr, 1);
        depth = gen_int(n_depth, 2);

        xmlDebugDumpAttrList(output, attr, depth);
        call_tests++;
        des_debug_FILE_ptr(n_output, output, 0);
        des_xmlAttrPtr(n_attr, attr, 1);
        des_int(n_depth, depth, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDebugDumpAttrList",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_output);
            printf(" %d", n_attr);
            printf(" %d", n_depth);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}